

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssvectorbase.h
# Opt level: O2

number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
* __thiscall
soplex::
SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
::operator*(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
            *__return_storage_ptr__,
           SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
           *this,SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *w)

{
  uint *puVar1;
  pointer pnVar2;
  int *piVar3;
  long lVar4;
  int iVar5;
  ulong uVar6;
  int iVar7;
  int *piVar8;
  int *piVar9;
  long lVar10;
  int iVar11;
  int iVar12;
  ulong uVar13;
  bool bVar14;
  StableSum<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  x;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  cpp_dec_float<50U,_int,_void> local_e0;
  cpp_dec_float<50U,_int,_void> local_a8;
  cpp_dec_float<50U,_int,_void> local_68;
  
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::setup((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)this);
  StableSum<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::StableSum((StableSum<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)&local_e0);
  iVar11 = (w->super_IdxSet).num;
  if (0 < iVar11 && 0 < *(int *)(this + 8)) {
    uVar6 = (ulong)(iVar11 - 1);
    uVar13 = (ulong)(*(int *)(this + 8) - 1);
    lVar4 = *(long *)(this + 0x10);
    piVar9 = (int *)(lVar4 + uVar13 * 4);
    piVar3 = (w->super_IdxSet).idx;
    piVar8 = piVar3 + uVar6;
LAB_0028d0ea:
    iVar11 = *piVar9;
    do {
      iVar7 = *piVar8;
      uVar13 = (ulong)(int)uVar13;
      while( true ) {
        iVar5 = (int)uVar6;
        lVar10 = (long)iVar5;
        iVar12 = (int)uVar13;
        if ((iVar12 == 0) || (iVar5 == 0)) goto LAB_0028d202;
        if (iVar11 == iVar7) {
          lVar4 = (long)iVar11;
          pnVar2 = (w->
                   super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          local_a8.data._M_elems._32_8_ =
               *(undefined8 *)((long)&pnVar2[lVar4].m_backend.data + 0x20);
          local_a8.data._M_elems._0_8_ = *(undefined8 *)&pnVar2[lVar4].m_backend.data;
          local_a8.data._M_elems._8_8_ = *(undefined8 *)((long)&pnVar2[lVar4].m_backend.data + 8);
          puVar1 = (uint *)((long)&pnVar2[lVar4].m_backend.data + 0x10);
          local_a8.data._M_elems._16_8_ = *(undefined8 *)puVar1;
          local_a8.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
          local_a8.exp = pnVar2[lVar4].m_backend.exp;
          local_a8.neg = pnVar2[lVar4].m_backend.neg;
          local_a8.fpclass = pnVar2[lVar4].m_backend.fpclass;
          local_a8.prec_elem = pnVar2[lVar4].m_backend.prec_elem;
          local_68.fpclass = cpp_dec_float_finite;
          local_68.prec_elem = 10;
          local_68.data._M_elems[0] = 0;
          local_68.data._M_elems[1] = 0;
          local_68.data._M_elems[2] = 0;
          local_68.data._M_elems[3] = 0;
          local_68.data._M_elems[4] = 0;
          local_68.data._M_elems[5] = 0;
          local_68.data._M_elems._24_5_ = 0;
          local_68.data._M_elems[7]._1_3_ = 0;
          local_68.data._M_elems._32_5_ = 0;
          local_68._37_8_ = 0;
          boost::multiprecision::default_ops::
          eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                    (&local_68,
                     (cpp_dec_float<50U,_int,_void> *)(*(long *)(this + 0x20) + lVar4 * 0x38),
                     &local_a8);
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                    (&local_e0,&local_68);
          uVar13 = (ulong)(iVar12 - 1U);
          lVar4 = *(long *)(this + 0x10);
          piVar9 = (int *)(lVar4 + (long)(int)(iVar12 - 1U) * 4);
          piVar3 = (w->super_IdxSet).idx;
          uVar6 = (ulong)(iVar5 - 1);
          piVar8 = piVar3 + (long)iVar5 + -1;
          goto LAB_0028d0ea;
        }
        if (iVar11 <= iVar7) break;
        uVar13 = uVar13 - 1;
        iVar11 = *(int *)(lVar4 + (long)(iVar12 + -1) * 4);
      }
      uVar6 = (ulong)(iVar5 - 1);
      piVar8 = piVar3 + (long)iVar5 + -1;
    } while( true );
  }
LAB_0028d29d:
  *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 8) =
       local_e0.data._M_elems._32_8_;
  *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 4) =
       local_e0.data._M_elems._16_8_;
  *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 6) =
       local_e0.data._M_elems._24_8_;
  *(undefined8 *)(__return_storage_ptr__->m_backend).data._M_elems = local_e0.data._M_elems._0_8_;
  *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 2) =
       local_e0.data._M_elems._8_8_;
  (__return_storage_ptr__->m_backend).exp = local_e0.exp;
  (__return_storage_ptr__->m_backend).neg = local_e0.neg;
  (__return_storage_ptr__->m_backend).fpclass = local_e0.fpclass;
  (__return_storage_ptr__->m_backend).prec_elem = local_e0.prec_elem;
  return __return_storage_ptr__;
LAB_0028d202:
  while ((bVar14 = uVar13 != 0, uVar13 = uVar13 - 1, bVar14 && (iVar11 != iVar7))) {
    iVar11 = *(int *)(lVar4 + uVar13 * 4);
  }
  while ((bVar14 = lVar10 != 0, lVar10 = lVar10 + -1, bVar14 && (iVar11 != iVar7))) {
    iVar7 = piVar3[lVar10];
  }
  if (iVar11 == iVar7) {
    lVar4 = (long)iVar11;
    pnVar2 = (w->
             super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_a8.data._M_elems._32_8_ = *(undefined8 *)((long)&pnVar2[lVar4].m_backend.data + 0x20);
    local_a8.data._M_elems._0_8_ = *(undefined8 *)&pnVar2[lVar4].m_backend.data;
    local_a8.data._M_elems._8_8_ = *(undefined8 *)((long)&pnVar2[lVar4].m_backend.data + 8);
    puVar1 = (uint *)((long)&pnVar2[lVar4].m_backend.data + 0x10);
    local_a8.data._M_elems._16_8_ = *(undefined8 *)puVar1;
    local_a8.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
    local_a8.exp = pnVar2[lVar4].m_backend.exp;
    local_a8.neg = pnVar2[lVar4].m_backend.neg;
    local_a8.fpclass = pnVar2[lVar4].m_backend.fpclass;
    local_a8.prec_elem = pnVar2[lVar4].m_backend.prec_elem;
    local_68.fpclass = cpp_dec_float_finite;
    local_68.prec_elem = 10;
    local_68.data._M_elems[0] = 0;
    local_68.data._M_elems[1] = 0;
    local_68.data._M_elems[2] = 0;
    local_68.data._M_elems[3] = 0;
    local_68.data._M_elems[4] = 0;
    local_68.data._M_elems[5] = 0;
    local_68.data._M_elems._24_5_ = 0;
    local_68.data._M_elems[7]._1_3_ = 0;
    local_68.data._M_elems._32_5_ = 0;
    local_68._37_8_ = 0;
    boost::multiprecision::default_ops::
    eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
              (&local_68,(cpp_dec_float<50U,_int,_void> *)(*(long *)(this + 0x20) + lVar4 * 0x38),
               &local_a8);
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=(&local_e0,&local_68);
  }
  goto LAB_0028d29d;
}

Assistant:

R operator*(const SSVectorBase<S>& w)
   {
      setup();

      StableSum<R> x;
      int i = size() - 1;
      int j = w.size() - 1;

      // both *this and w non-zero vectors?
      if(i >= 0 && j >= 0)
      {
         int vi = index(i);
         int wj = w.index(j);

         while(i != 0 && j != 0)
         {
            if(vi == wj)
            {
               x += VectorBase<R>::val[vi] * R(w.val[wj]);
               vi = index(--i);
               wj = w.index(--j);
            }
            else if(vi > wj)
               vi = index(--i);
            else
               wj = w.index(--j);
         }

         /* check remaining indices */

         while(i != 0 && vi != wj)
            vi = index(--i);

         while(j != 0 && vi != wj)
            wj = w.index(--j);

         if(vi == wj)
            x += VectorBase<R>::val[vi] * R(w.val[wj]);
      }

      return x;
   }